

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::FullyConnectedLayer::outputInplace(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  size_t sVar2;
  float *__s;
  
  peVar1 = (this->super_ABackpropLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = this->nOutputs;
  if (peVar1->_M_size != sVar2) {
    operator_delete(peVar1->_M_data);
    peVar1->_M_size = sVar2;
    __s = (float *)operator_new(sVar2 * 4);
    peVar1->_M_data = __s;
    if (sVar2 != 0) {
      memset(__s,0,sVar2 * 4);
    }
  }
  rememberInputs(this,inputs);
  calcInducedLocalField(this,inputs);
  calcActivationGrad(this);
  calcOutput(this);
  return;
}

Assistant:

void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nOutputs) {
            outputs.resize(nOutputs);
        }
        rememberInputs(inputs);
        calcInducedLocalField(inputs);
        calcActivationGrad();
        calcOutput();
    }